

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

uint zt_log_set_opts(zt_log_ty *log,uint opts)

{
  uint uVar1;
  uint in_ESI;
  zt_log_ty *in_RDI;
  uint oopts;
  zt_log_ty *local_10;
  
  local_10 = in_RDI;
  if ((in_RDI == (zt_log_ty *)0x0) && (local_10 = zt_log_get_logger(), local_10 == (zt_log_ty *)0x0)
     ) {
    return 0;
  }
  uVar1 = local_10->opts;
  local_10->opts = in_ESI;
  return uVar1;
}

Assistant:

unsigned int
zt_log_set_opts(zt_log_ty * log, unsigned int opts) {
    unsigned int oopts;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        return 0;
    }

    oopts     = log->opts;
    log->opts = opts;
    return oopts;
}